

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformparser.cpp
# Opt level: O2

mat4f * parseTransform(mat4f *__return_storage_ptr__,Json *conf)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  const_reference pvVar9;
  undefined8 *puVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vec3f vVar18;
  vector<float,_std::allocator<float>_> v;
  primitive_iterator_t pStack_88;
  float local_80 [2];
  float afStack_78 [2];
  float local_70 [2];
  float afStack_68 [2];
  undefined1 local_60 [24];
  float local_48;
  float local_44;
  float local_40 [2];
  float local_38;
  undefined8 local_34;
  float afStack_2c [3];
  
  if (conf->m_type == array) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              (&v,conf);
    if ((long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 0x40) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = "bad transformation matrix";
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    uVar1 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 2);
    uVar2 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 4);
    uVar3 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 6);
    uVar4 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 8);
    uVar5 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 10);
    uVar6 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 0xc);
    uVar7 = *(undefined8 *)
             (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start + 0xe);
    *(undefined8 *)__return_storage_ptr__->data[0] =
         *(undefined8 *)
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
    *(undefined8 *)(__return_storage_ptr__->data[0] + 2) = uVar1;
    *(undefined8 *)__return_storage_ptr__->data[1] = uVar2;
    *(undefined8 *)(__return_storage_ptr__->data[1] + 2) = uVar3;
    *(undefined8 *)__return_storage_ptr__->data[2] = uVar4;
    *(undefined8 *)(__return_storage_ptr__->data[2] + 2) = uVar5;
    *(undefined8 *)__return_storage_ptr__->data[3] = uVar6;
    *(undefined8 *)(__return_storage_ptr__->data[3] + 2) = uVar7;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&v.super__Vector_base<float,_std::allocator<float>_>);
  }
  else {
    *(float *)((long)(__return_storage_ptr__->data + 3) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 3) + 0xc) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 8) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 2) + 0xc) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 4) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 1) + 0xc) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 0) = 1.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->data + 0) + 0xc) = 0.0;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[6]>
              ((const_iterator *)&v,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [6])"scale");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)local_60,conf);
    bVar8 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((const_iterator *)&v,(const_iterator *)local_60);
    if (bVar8) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"scale");
      vVar18 = json2vec3f(pvVar9);
      __return_storage_ptr__->data[0][0] = vVar18.x;
      __return_storage_ptr__->data[1][1] = vVar18.y;
      __return_storage_ptr__->data[2][2] = vVar18.z;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              ((const_iterator *)&v,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [9])"rotation");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)local_60,conf);
    bVar8 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((const_iterator *)&v,(const_iterator *)local_60);
    if (bVar8) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"rotation");
      vVar18 = json2vec3f(pvVar9);
      fVar17 = (vVar18.x * 3.1415927) / 180.0;
      fVar11 = (vVar18.y * 3.1415927) / 180.0;
      fVar16 = (vVar18.z * 3.1415927) / 180.0;
      fVar12 = cosf(fVar17);
      fVar13 = cosf(fVar11);
      fVar14 = cosf(fVar16);
      fVar17 = sinf(fVar17);
      fVar11 = sinf(fVar11);
      fVar16 = sinf(fVar16);
      fVar15 = -fVar11;
      local_60._8_4_ = fVar12 * fVar15;
      local_48 = -fVar17;
      local_38 = fVar12 * fVar13;
      local_60._0_8_ =
           CONCAT44(-fVar13 * fVar16 + fVar17 * fVar15 * fVar14,
                    fVar13 * fVar14 + fVar17 * fVar15 * fVar16);
      local_60._12_4_ = 0.0;
      local_60._16_8_ = CONCAT44(fVar12 * fVar14,fVar12 * fVar16);
      local_44 = 0.0;
      local_40[1] = fVar15 * fVar16 + fVar17 * fVar13 * fVar14;
      local_40[0] = fVar11 * fVar14 + fVar17 * fVar13 * fVar16;
      local_34._0_4_ = 0.0;
      local_34._4_4_ = 0.0;
      afStack_2c[0] = 0.0;
      afStack_2c[1] = 0.0;
      afStack_2c[2] = 1.0;
      operator*((mat4f *)&v,(mat4f *)local_60,__return_storage_ptr__);
      *(float (*) [2])__return_storage_ptr__->data[3] = local_70;
      *(float (*) [2])(__return_storage_ptr__->data[3] + 2) = afStack_68;
      *(float (*) [2])__return_storage_ptr__->data[2] = local_80;
      *(float (*) [2])(__return_storage_ptr__->data[2] + 2) = afStack_78;
      *(pointer *)__return_storage_ptr__->data[1] =
           v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(difference_type *)(__return_storage_ptr__->data[1] + 2) = pStack_88.m_it;
      *(pointer *)__return_storage_ptr__->data[0] =
           v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(pointer *)(__return_storage_ptr__->data[0] + 2) =
           v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[9]>
              ((const_iterator *)&v,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [9])"position");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::cend((const_iterator *)local_60,conf);
    bVar8 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((const_iterator *)&v,(const_iterator *)local_60);
    if (bVar8) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"position");
      vVar18 = json2vec3f(pvVar9);
      __return_storage_ptr__->data[0][3] = vVar18.x;
      __return_storage_ptr__->data[1][3] = vVar18.y;
      __return_storage_ptr__->data[2][3] = vVar18.z;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat4f parseTransform(const Json& conf) {
	if (conf.type() == Json::value_t::array) {
		std::vector<float> v = conf;
		if (v.size() != 16)
			throw "bad transformation matrix";
		return mat4f(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7],v[8],v[9],v[10],v[11],v[12],v[13],v[14],v[15]);
	}
	mat4f trans = mat4f::unit;
	if (conf.find("scale") != conf.end()) {
		vec3f scale = json2vec3f(conf["scale"]);
		trans[0][0] = scale.x;
		trans[1][1] = scale.y;
		trans[2][2] = scale.z;
	}
	if (conf.find("rotation") != conf.end()) {
		// in degrees
		trans = rotYXZ(json2vec3f(conf["rotation"])) * trans;
	}
	if (conf.find("position") != conf.end()) {
		vec3f offset = json2vec3f(conf["position"]);
		trans[0][3] = offset.x;
		trans[1][3] = offset.y;
		trans[2][3] = offset.z;
	}
	return trans;
}